

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall
wasm::Module::removeElementSegments(Module *this,function<bool_(wasm::ElementSegment_*)> *pred)

{
  function<bool_(wasm::ElementSegment_*)> local_40;
  
  std::function<bool_(wasm::ElementSegment_*)>::function(&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>,std::unordered_map<wasm::Name,wasm::ElementSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::ElementSegment*>>>,wasm::ElementSegment>
            (&this->elementSegments,&this->elementSegmentsMap,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void Module::removeElementSegments(std::function<bool(ElementSegment*)> pred) {
  removeModuleElements(elementSegments, elementSegmentsMap, pred);
}